

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::setProxyModel(QFileDialog *this,QAbstractProxyModel *proxyModel)

{
  QFileDialogPrivate *this_00;
  QFileDialogListView *pQVar1;
  QFileDialogTreeView *pQVar2;
  QFSCompleter *pQVar3;
  Ui_QFileDialog *pUVar4;
  QItemSelectionModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QAbstractProxyModel *pQVar7;
  ConnectionType type;
  QItemSelectionModel *oldD;
  Object *sender;
  long in_FS_OFFSET;
  Object local_78 [8];
  Object local_70 [8];
  Object local_68 [8];
  code *local_60;
  undefined8 uStack_58;
  Object local_50 [8];
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (((((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
       ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) &&
      (proxyModel != (QAbstractProxyModel *)0x0 || this_00->proxyModel != (QAbstractProxyModel *)0x0
      )) && (this_00->proxyModel != proxyModel)) {
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::rootIndex((QModelIndex *)&local_48,this_00);
    pQVar7 = this_00->proxyModel;
    if (pQVar7 == (QAbstractProxyModel *)0x0) {
      pQVar7 = (QAbstractProxyModel *)this_00->model;
    }
    QObjectPrivate::
    disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              ((Object *)pQVar7,
               (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsInserted,(Object *)0x0,
               (Function)this_00);
    if (proxyModel == (QAbstractProxyModel *)0x0) {
      this_00->proxyModel = (QAbstractProxyModel *)0x0;
      pQVar1 = ((this_00->qFileDialogUi).d)->listView;
      (**(code **)(*(long *)&(pQVar1->super_QListView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pQVar1,this_00->model);
      pQVar2 = ((this_00->qFileDialogUi).d)->treeView;
      (**(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pQVar2,this_00->model);
      QCompleter::setModel
                (&this_00->completer->super_QCompleter,(QAbstractItemModel *)this_00->model);
      pQVar7 = (QAbstractProxyModel *)this_00->model;
      pQVar3 = this_00->completer;
      pQVar3->sourceModel = (QFileSystemModel *)pQVar7;
      pQVar3->proxyModel = (QAbstractProxyModel *)0x0;
      sender = local_68;
    }
    else {
      QObject::setParent((QObject *)proxyModel);
      this_00->proxyModel = proxyModel;
      (**(code **)(*(long *)proxyModel + 0x188))(proxyModel,this_00->model);
      pQVar1 = ((this_00->qFileDialogUi).d)->listView;
      (**(code **)(*(long *)&(pQVar1->super_QListView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pQVar1,this_00->proxyModel);
      pQVar2 = ((this_00->qFileDialogUi).d)->treeView;
      (**(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pQVar2,this_00->proxyModel);
      QCompleter::setModel
                (&this_00->completer->super_QCompleter,(QAbstractItemModel *)this_00->proxyModel);
      pQVar7 = this_00->proxyModel;
      this_00->completer->proxyModel = pQVar7;
      sender = local_50;
    }
    uStack_58 = 0;
    local_60 = QFileDialogPrivate::rowsInserted;
    type = (ConnectionType)this_00;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              (sender,(offset_in_QAbstractItemModel_to_subr)pQVar7,
               (Object *)QAbstractItemModel::rowsInserted,0,type);
    QMetaObject::Connection::~Connection((Connection *)sender);
    pQVar5 = QAbstractItemView::selectionModel
                       ((QAbstractItemView *)((this_00->qFileDialogUi).d)->treeView);
    pUVar4 = (this_00->qFileDialogUi).d;
    pQVar2 = pUVar4->treeView;
    pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)pUVar4->listView);
    (**(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1d0))
              (pQVar2,pQVar6);
    QFileDialogPrivate::setRootIndex(this_00,(QModelIndex *)&local_48);
    pQVar6 = QAbstractItemView::selectionModel
                       ((QAbstractItemView *)((this_00->qFileDialogUi).d)->listView);
    local_60 = QFileDialogPrivate::selectionChanged;
    uStack_58 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QFileDialogPrivate::*)()>
              (local_70,(offset_in_QItemSelectionModel_to_subr)pQVar6,
               (Object *)QItemSelectionModel::selectionChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    local_60 = QFileDialogPrivate::currentChanged;
    uStack_58 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              (local_78,(offset_in_QItemSelectionModel_to_subr)pQVar6,
               (Object *)QItemSelectionModel::currentChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_78);
    if (pQVar5 != (QItemSelectionModel *)0x0) {
      (**(code **)(*(long *)pQVar5 + 0x20))(pQVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setProxyModel(QAbstractProxyModel *proxyModel)
{
    Q_D(QFileDialog);
    if (!d->usingWidgets())
        return;
    if ((!proxyModel && !d->proxyModel)
        || (proxyModel == d->proxyModel))
        return;

    QModelIndex idx = d->rootIndex();
    if (d->proxyModel)
        QObjectPrivate::disconnect(d->proxyModel, &QAbstractProxyModel::rowsInserted,
                                   d, &QFileDialogPrivate::rowsInserted);
    else
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::rowsInserted,
                                   d, &QFileDialogPrivate::rowsInserted);

    if (proxyModel != nullptr) {
        proxyModel->setParent(this);
        d->proxyModel = proxyModel;
        proxyModel->setSourceModel(d->model);
        d->qFileDialogUi->listView->setModel(d->proxyModel);
        d->qFileDialogUi->treeView->setModel(d->proxyModel);
#if QT_CONFIG(fscompleter)
        d->completer->setModel(d->proxyModel);
        d->completer->proxyModel = d->proxyModel;
#endif
        QObjectPrivate::connect(d->proxyModel, &QAbstractItemModel::rowsInserted,
                                d, &QFileDialogPrivate::rowsInserted);
    } else {
        d->proxyModel = nullptr;
        d->qFileDialogUi->listView->setModel(d->model);
        d->qFileDialogUi->treeView->setModel(d->model);
#if QT_CONFIG(fscompleter)
        d->completer->setModel(d->model);
        d->completer->sourceModel = d->model;
        d->completer->proxyModel = nullptr;
#endif
        QObjectPrivate::connect(d->model, &QAbstractItemModel::rowsInserted,
                                d, &QFileDialogPrivate::rowsInserted);
    }
    QScopedPointer<QItemSelectionModel> selModel(d->qFileDialogUi->treeView->selectionModel());
    d->qFileDialogUi->treeView->setSelectionModel(d->qFileDialogUi->listView->selectionModel());

    d->setRootIndex(idx);

    // reconnect selection
    QItemSelectionModel *selections = d->qFileDialogUi->listView->selectionModel();
    QObjectPrivate::connect(selections, &QItemSelectionModel::selectionChanged,
                            d, &QFileDialogPrivate::selectionChanged);
    QObjectPrivate::connect(selections, &QItemSelectionModel::currentChanged,
                            d, &QFileDialogPrivate::currentChanged);
}